

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O1

void save2(char *filename)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List obj_list;
  ofstream out_file;
  Am_Value local_240;
  Am_Object local_230;
  Am_Object local_228;
  Am_Object local_220;
  Am_Value_List local_218 [16];
  undefined1 local_208 [32];
  byte abStack_1e8 [216];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(local_208,filename,_S_out);
  if ((abStack_1e8[*(long *)(local_208._0_8_ + -0x18)] & 5) == 0) {
    Am_Value_List::Am_Value_List(local_218);
    Am_Object::Create((char *)&local_240);
    pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
    uVar1 = Am_Object::Set((ushort)&local_240,(Am_Wrapper *)0x6a,(ulong)pAVar2);
    uVar1 = Am_Object::Set(uVar1,100,10);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x65,10);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
    pAVar2 = (Am_Wrapper *)Am_Value_List::Add((Am_Wrapper *)local_218,(Am_Add_Position)pAVar2,true);
    Am_Object::Create((char *)&local_220);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
    uVar1 = Am_Object::Set((ushort)&local_220,(Am_Wrapper *)0x6a,(ulong)pAVar4);
    uVar1 = Am_Object::Set(uVar1,100,0x46);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x65,10);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
    pAVar2 = (Am_Wrapper *)Am_Value_List::Add(pAVar2,(Am_Add_Position)pAVar4,true);
    Am_Object::Create((char *)&local_228);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    uVar1 = Am_Object::Set((ushort)&local_228,(Am_Wrapper *)0x6a,(ulong)pAVar4);
    uVar1 = Am_Object::Set(uVar1,100,10);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x65,0x46);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
    pAVar2 = (Am_Wrapper *)Am_Value_List::Add(pAVar2,(Am_Add_Position)pAVar4,true);
    Am_Object::Create((char *)&local_230);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    uVar1 = Am_Object::Set((ushort)&local_230,(Am_Wrapper *)0x6b,(ulong)pAVar4);
    uVar1 = Am_Object::Add(uVar1,0x8b,0x46);
    uVar1 = Am_Object::Add(uVar1,0x8c,0x46);
    uVar1 = Am_Object::Add(uVar1,0x8d,0x78);
    pAVar3 = (Am_Object *)Am_Object::Add(uVar1,0x8e,0x78);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
    Am_Value_List::Add(pAVar2,(Am_Add_Position)pAVar4,true);
    Am_Object::~Am_Object(&local_230);
    Am_Object::~Am_Object(&local_228);
    Am_Object::~Am_Object(&local_220);
    Am_Object::~Am_Object((Am_Object *)&local_240);
    Am_Load_Save_Context::Reset();
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_218);
    Am_Value::Am_Value(&local_240,pAVar2);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)local_208);
    Am_Value::~Am_Value(&local_240);
    Am_Value_List::~Am_Value_List(local_218);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  local_208._0_8_ = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18)) = _Am_Red;
  std::filebuf::~filebuf((filebuf *)(local_208 + 8));
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void
save2(const char *filename)
{
  std::ofstream out_file(filename, std::ios::out);
  if (!out_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  Am_Value_List obj_list;
  obj_list
      .Add(Proto_Rect.Create()
               .Set(Am_FILL_STYLE, Am_Red)
               .Set(Am_LEFT, 10)
               .Set(Am_TOP, 10))
      .Add(Proto_Rect.Create()
               .Set(Am_FILL_STYLE, Am_Red)
               .Set(Am_LEFT, 70)
               .Set(Am_TOP, 10))
      .Add(Proto_Rect.Create()
               .Set(Am_FILL_STYLE, Am_Blue)
               .Set(Am_LEFT, 10)
               .Set(Am_TOP, 70))
      .Add(Proto_Line.Create()
               .Set(Am_LINE_STYLE, Am_Blue)
               .Add(Am_X1, 70)
               .Add(Am_Y1, 70)
               .Add(Am_X2, 120)
               .Add(Am_Y2, 120));

  Am_Default_Load_Save_Context.Reset();
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(obj_list));
}